

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

char * helics::commandErrorString(int errorCode)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  value_type *res;
  char *local_20;
  int *in_stack_ffffffffffffffe8;
  unordered_map<int,_std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_frozen::elsa<int>,_std::equal_to<int>_>
  *in_stack_fffffffffffffff0;
  const_iterator pvVar3;
  
  pvVar1 = frozen::
           unordered_map<int,_std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_frozen::elsa<int>,_std::equal_to<int>_>
           ::find<int>(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  pvVar3 = pvVar1;
  pvVar2 = frozen::
           unordered_map<int,_std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_frozen::elsa<int>,_std::equal_to<int>_>
           ::end((unordered_map<int,_std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_frozen::elsa<int>,_std::equal_to<int>_>
                  *)0x50ad34);
  if (pvVar1 == pvVar2) {
    local_20 = "unknown";
  }
  else {
    local_20 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&pvVar3->second);
  }
  return local_20;
}

Assistant:

const char* commandErrorString(int errorCode)
{
    const auto* res = errorStrings.find(errorCode);
    return (res != errorStrings.end()) ? res->second.data() : static_cast<const char*>(unknownStr);
}